

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cGPUShaderFP64Tests.cpp
# Opt level: O0

IterateResult __thiscall gl4cts::GPUShaderFP64Test5::iterate(GPUShaderFP64Test5 *this)

{
  bool bVar1;
  ContextInfo *pCVar2;
  NotSupportedError *pNVar3;
  _test_case *local_848;
  _test_case *test_case;
  uint n_test_case;
  uint n_test_cases;
  allocator<char> local_608;
  allocator<char> local_607;
  allocator<char> local_606;
  allocator<char> local_605;
  allocator<char> local_604;
  allocator<char> local_603;
  allocator<char> local_602;
  allocator<char> local_601;
  allocator<char> local_600;
  allocator<char> local_5ff;
  allocator<char> local_5fe;
  allocator<char> local_5fd;
  allocator<char> local_5fc;
  allocator<char> local_5fb;
  allocator<char> local_5fa;
  allocator<char> local_5f9;
  allocator<char> local_5f8;
  allocator<char> local_5f7;
  allocator<char> local_5f6;
  allocator<char> local_5f5;
  allocator<char> local_5f4;
  allocator<char> local_5f3;
  allocator<char> local_5f2;
  allocator<char> local_5f1;
  undefined1 *local_5f0;
  undefined1 local_5e8 [8];
  _test_case test_cases [29];
  string local_70;
  undefined1 local_4d;
  allocator<char> local_39;
  string local_38;
  GPUShaderFP64Test5 *local_18;
  GPUShaderFP64Test5 *this_local;
  
  local_18 = this;
  pCVar2 = deqp::Context::getContextInfo((this->super_TestCase).m_context);
  bVar1 = glu::ContextInfo::isExtensionSupported(pCVar2,"GL_ARB_gpu_shader_fp64");
  if (!bVar1) {
    local_4d = 1;
    pNVar3 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_38,"GL_ARB_gpu_shader_fp64 is not supported.",&local_39);
    tcu::NotSupportedError::NotSupportedError(pNVar3,&local_38);
    local_4d = 0;
    __cxa_throw(pNVar3,&tcu::NotSupportedError::typeinfo,tcu::NotSupportedError::~NotSupportedError)
    ;
  }
  pCVar2 = deqp::Context::getContextInfo((this->super_TestCase).m_context);
  bVar1 = glu::ContextInfo::isExtensionSupported(pCVar2,"GL_ARB_vertex_attrib_64bit");
  if (!bVar1) {
    test_cases[0x1c].shader_body.field_2._M_local_buf[0xe] = '\x01';
    pNVar3 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_70,"GL_ARB_vertex_attrib_64bit is not supported.",
               (allocator<char> *)(test_cases[0x1c].shader_body.field_2._M_local_buf + 0xf));
    tcu::NotSupportedError::NotSupportedError(pNVar3,&local_70);
    test_cases[0x1c].shader_body.field_2._M_local_buf[0xe] = '\0';
    __cxa_throw(pNVar3,&tcu::NotSupportedError::typeinfo,tcu::NotSupportedError::~NotSupportedError)
    ;
  }
  initTest(this);
  n_test_case._2_1_ = 1;
  local_5f0 = local_5e8;
  local_5e8._0_4_ = TEST_CASE_TYPE_IMPLICIT;
  local_5e8._4_4_ = VARIABLE_TYPE_INT;
  test_cases[0].type = 4;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&test_cases[0].dst_type,"",&local_5f1);
  local_5f0 = (undefined1 *)((long)&test_cases[0].shader_body.field_2 + 8);
  test_cases[0].shader_body.field_2._8_4_ = 1;
  test_cases[0].shader_body.field_2._12_4_ = 0x13;
  test_cases[1].type = 0xe;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&test_cases[1].dst_type,"",&local_5f2);
  local_5f0 = (undefined1 *)((long)&test_cases[1].shader_body.field_2 + 8);
  test_cases[1].shader_body.field_2._8_4_ = 1;
  test_cases[1].shader_body.field_2._12_4_ = 0x14;
  test_cases[2].type = 0xf;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&test_cases[2].dst_type,"",&local_5f3);
  local_5f0 = (undefined1 *)((long)&test_cases[2].shader_body.field_2 + 8);
  test_cases[2].shader_body.field_2._8_4_ = 1;
  test_cases[2].shader_body.field_2._12_4_ = 0x15;
  test_cases[3].type = 0x10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&test_cases[3].dst_type,"",&local_5f4);
  local_5f0 = (undefined1 *)((long)&test_cases[3].shader_body.field_2 + 8);
  test_cases[3].shader_body.field_2._8_4_ = 1;
  test_cases[3].shader_body.field_2._12_4_ = 0x1f;
  test_cases[4].type = 4;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&test_cases[4].dst_type,"",&local_5f5);
  local_5f0 = (undefined1 *)((long)&test_cases[4].shader_body.field_2 + 8);
  test_cases[4].shader_body.field_2._8_4_ = 1;
  test_cases[4].shader_body.field_2._12_4_ = 0x20;
  test_cases[5].type = 0xe;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&test_cases[5].dst_type,"",&local_5f6);
  local_5f0 = (undefined1 *)((long)&test_cases[5].shader_body.field_2 + 8);
  test_cases[5].shader_body.field_2._8_4_ = 1;
  test_cases[5].shader_body.field_2._12_4_ = 0x21;
  test_cases[6].type = 0xf;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&test_cases[6].dst_type,"",&local_5f7);
  local_5f0 = (undefined1 *)((long)&test_cases[6].shader_body.field_2 + 8);
  test_cases[6].shader_body.field_2._8_4_ = 1;
  test_cases[6].shader_body.field_2._12_4_ = 0x22;
  test_cases[7].type = 0x10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&test_cases[7].dst_type,"",&local_5f8);
  local_5f0 = (undefined1 *)((long)&test_cases[7].shader_body.field_2 + 8);
  test_cases[7].shader_body.field_2._8_4_ = 1;
  test_cases[7].shader_body.field_2._12_4_ = 0x11;
  test_cases[8].type = 4;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&test_cases[8].dst_type,"",&local_5f9);
  local_5f0 = (undefined1 *)((long)&test_cases[8].shader_body.field_2 + 8);
  test_cases[8].shader_body.field_2._8_4_ = 1;
  test_cases[8].shader_body.field_2._12_4_ = 0x23;
  test_cases[9].type = 0xe;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&test_cases[9].dst_type,"",&local_5fa);
  local_5f0 = (undefined1 *)((long)&test_cases[9].shader_body.field_2 + 8);
  test_cases[9].shader_body.field_2._8_4_ = 1;
  test_cases[9].shader_body.field_2._12_4_ = 0x24;
  test_cases[10].type = 0xf;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&test_cases[10].dst_type,"",&local_5fb);
  local_5f0 = (undefined1 *)((long)&test_cases[10].shader_body.field_2 + 8);
  test_cases[10].shader_body.field_2._8_4_ = 1;
  test_cases[10].shader_body.field_2._12_4_ = 0x25;
  test_cases[0xb].type = 0x10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&test_cases[0xb].dst_type,"",&local_5fc);
  local_5f0 = (undefined1 *)((long)&test_cases[0xb].shader_body.field_2 + 8);
  test_cases[0xb].shader_body.field_2._8_4_ = 1;
  test_cases[0xb].shader_body.field_2._12_4_ = 0x16;
  test_cases[0xc].type = 5;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&test_cases[0xc].dst_type,"",&local_5fd);
  local_5f0 = (undefined1 *)((long)&test_cases[0xc].shader_body.field_2 + 8);
  test_cases[0xc].shader_body.field_2._8_4_ = 1;
  test_cases[0xc].shader_body.field_2._12_4_ = 0x19;
  test_cases[0xd].type = 8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&test_cases[0xd].dst_type,"",&local_5fe);
  local_5f0 = (undefined1 *)((long)&test_cases[0xd].shader_body.field_2 + 8);
  test_cases[0xd].shader_body.field_2._8_4_ = 1;
  test_cases[0xd].shader_body.field_2._12_4_ = 0x1c;
  test_cases[0xe].type = 0xb;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&test_cases[0xe].dst_type,"",&local_5ff);
  local_5f0 = (undefined1 *)((long)&test_cases[0xe].shader_body.field_2 + 8);
  test_cases[0xe].shader_body.field_2._8_4_ = 1;
  test_cases[0xe].shader_body.field_2._12_4_ = 0x17;
  test_cases[0xf].type = 6;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&test_cases[0xf].dst_type,"",&local_600);
  local_5f0 = (undefined1 *)((long)&test_cases[0xf].shader_body.field_2 + 8);
  test_cases[0xf].shader_body.field_2._8_4_ = 1;
  test_cases[0xf].shader_body.field_2._12_4_ = 0x18;
  test_cases[0x10].type = 7;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&test_cases[0x10].dst_type,"",&local_601);
  local_5f0 = (undefined1 *)((long)&test_cases[0x10].shader_body.field_2 + 8);
  test_cases[0x10].shader_body.field_2._8_4_ = 1;
  test_cases[0x10].shader_body.field_2._12_4_ = 0x1a;
  test_cases[0x11].type = 9;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&test_cases[0x11].dst_type,"",&local_602);
  local_5f0 = (undefined1 *)((long)&test_cases[0x11].shader_body.field_2 + 8);
  test_cases[0x11].shader_body.field_2._8_4_ = 1;
  test_cases[0x11].shader_body.field_2._12_4_ = 0x1b;
  test_cases[0x12].type = 10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&test_cases[0x12].dst_type,"",&local_603);
  local_5f0 = (undefined1 *)((long)&test_cases[0x12].shader_body.field_2 + 8);
  test_cases[0x12].shader_body.field_2._8_4_ = 1;
  test_cases[0x12].shader_body.field_2._12_4_ = 0x1d;
  test_cases[0x13].type = 0xc;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&test_cases[0x13].dst_type,"",&local_604);
  local_5f0 = (undefined1 *)((long)&test_cases[0x13].shader_body.field_2 + 8);
  test_cases[0x13].shader_body.field_2._8_4_ = 1;
  test_cases[0x13].shader_body.field_2._12_4_ = 0x1e;
  test_cases[0x14].type = 0xd;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&test_cases[0x14].dst_type,"",&local_605);
  local_5f0 = (undefined1 *)((long)&test_cases[0x14].shader_body.field_2 + 8);
  test_cases[0x14].shader_body.field_2._8_4_ = 0;
  test_cases[0x14].shader_body.field_2._12_4_ = 0x12;
  test_cases[0x15].type = 4;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&test_cases[0x15].dst_type,"",&local_606);
  local_5f0 = (undefined1 *)((long)&test_cases[0x15].shader_body.field_2 + 8);
  test_cases[0x15].shader_body.field_2._8_4_ = 0;
  test_cases[0x15].shader_body.field_2._12_4_ = 0x1f;
  test_cases[0x16].type = 4;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&test_cases[0x16].dst_type,"",&local_607);
  local_5f0 = (undefined1 *)((long)&test_cases[0x16].shader_body.field_2 + 8);
  test_cases[0x16].shader_body.field_2._8_4_ = 0;
  test_cases[0x16].shader_body.field_2._12_4_ = 0x11;
  test_cases[0x17].type = 4;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&test_cases[0x17].dst_type,"",&local_608);
  local_5f0 = (undefined1 *)((long)&test_cases[0x17].shader_body.field_2 + 8);
  test_cases[0x17].shader_body.field_2._8_4_ = 0;
  test_cases[0x17].shader_body.field_2._12_4_ = 4;
  test_cases[0x18].type = 0x12;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&test_cases[0x18].dst_type,"",(allocator<char> *)((long)&n_test_cases + 3));
  local_5f0 = (undefined1 *)((long)&test_cases[0x18].shader_body.field_2 + 8);
  test_cases[0x18].shader_body.field_2._8_4_ = 0;
  test_cases[0x18].shader_body.field_2._12_4_ = 4;
  test_cases[0x19].type = 0x1f;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&test_cases[0x19].dst_type,"",(allocator<char> *)((long)&n_test_cases + 2));
  local_5f0 = (undefined1 *)((long)&test_cases[0x19].shader_body.field_2 + 8);
  test_cases[0x19].shader_body.field_2._8_4_ = 0;
  test_cases[0x19].shader_body.field_2._12_4_ = 4;
  test_cases[0x1a].type = 0x11;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&test_cases[0x1a].dst_type,"",(allocator<char> *)((long)&n_test_cases + 1));
  local_5f0 = (undefined1 *)((long)&test_cases[0x1a].shader_body.field_2 + 8);
  test_cases[0x1a].shader_body.field_2._8_4_ = 0;
  test_cases[0x1a].shader_body.field_2._12_4_ = 4;
  test_cases[0x1b].type = TEST_CASE_TYPE_EXPLICIT;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&test_cases[0x1b].dst_type,"",(allocator<char> *)&n_test_cases);
  local_5f0 = (undefined1 *)((long)&test_cases[0x1b].shader_body.field_2 + 8);
  test_cases[0x1b].shader_body.field_2._8_4_ = 0;
  test_cases[0x1b].shader_body.field_2._12_4_ = 0;
  test_cases[0x1c].type = 4;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&test_cases[0x1c].dst_type,"",(allocator<char> *)((long)&n_test_case + 3));
  n_test_case._2_1_ = 0;
  std::allocator<char>::~allocator((allocator<char> *)((long)&n_test_case + 3));
  std::allocator<char>::~allocator((allocator<char> *)&n_test_cases);
  std::allocator<char>::~allocator((allocator<char> *)((long)&n_test_cases + 1));
  std::allocator<char>::~allocator((allocator<char> *)((long)&n_test_cases + 2));
  std::allocator<char>::~allocator((allocator<char> *)((long)&n_test_cases + 3));
  std::allocator<char>::~allocator(&local_608);
  std::allocator<char>::~allocator(&local_607);
  std::allocator<char>::~allocator(&local_606);
  std::allocator<char>::~allocator(&local_605);
  std::allocator<char>::~allocator(&local_604);
  std::allocator<char>::~allocator(&local_603);
  std::allocator<char>::~allocator(&local_602);
  std::allocator<char>::~allocator(&local_601);
  std::allocator<char>::~allocator(&local_600);
  std::allocator<char>::~allocator(&local_5ff);
  std::allocator<char>::~allocator(&local_5fe);
  std::allocator<char>::~allocator(&local_5fd);
  std::allocator<char>::~allocator(&local_5fc);
  std::allocator<char>::~allocator(&local_5fb);
  std::allocator<char>::~allocator(&local_5fa);
  std::allocator<char>::~allocator(&local_5f9);
  std::allocator<char>::~allocator(&local_5f8);
  std::allocator<char>::~allocator(&local_5f7);
  std::allocator<char>::~allocator(&local_5f6);
  std::allocator<char>::~allocator(&local_5f5);
  std::allocator<char>::~allocator(&local_5f4);
  std::allocator<char>::~allocator(&local_5f3);
  std::allocator<char>::~allocator(&local_5f2);
  std::allocator<char>::~allocator(&local_5f1);
  for (test_case._0_4_ = 0; (uint)test_case < 0x1d; test_case._0_4_ = (uint)test_case + 1) {
    initIteration(this,(_test_case *)(local_5e8 + (ulong)(uint)test_case * 0x30));
    bVar1 = executeIteration(this,(_test_case *)(local_5e8 + (ulong)(uint)test_case * 0x30));
    this->m_has_test_passed = (bool)(bVar1 & this->m_has_test_passed);
    deinitInteration(this);
  }
  if ((this->m_has_test_passed & 1U) == 0) {
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL,
               "Fail");
  }
  else {
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,
               "Pass");
  }
  this_local._4_4_ = STOP;
  local_848 = (_test_case *)((long)&test_cases[0x1c].shader_body.field_2 + 8);
  do {
    local_848 = local_848 + -1;
    _test_case::~_test_case(local_848);
  } while (local_848 != (_test_case *)local_5e8);
  return this_local._4_4_;
}

Assistant:

tcu::TestNode::IterateResult GPUShaderFP64Test5::iterate()
{
	/* Do not execute the test if GL_ARB_texture_view is not supported */
	if (!m_context.getContextInfo().isExtensionSupported("GL_ARB_gpu_shader_fp64"))
	{
		throw tcu::NotSupportedError("GL_ARB_gpu_shader_fp64 is not supported.");
	}

	if (!m_context.getContextInfo().isExtensionSupported("GL_ARB_vertex_attrib_64bit"))
	{
		throw tcu::NotSupportedError("GL_ARB_vertex_attrib_64bit is not supported.");
	}

	/* Initialize GL objects needed to run the tests */
	initTest();

	/* Build iteration array to run the tests in an automated manner */
	_test_case test_cases[] = {
		/* test case type */ /* source type */ /* destination type */
		{ TEST_CASE_TYPE_IMPLICIT, Utils::VARIABLE_TYPE_INT, Utils::VARIABLE_TYPE_DOUBLE, "" },
		{ TEST_CASE_TYPE_IMPLICIT, Utils::VARIABLE_TYPE_IVEC2, Utils::VARIABLE_TYPE_DVEC2, "" },
		{ TEST_CASE_TYPE_IMPLICIT, Utils::VARIABLE_TYPE_IVEC3, Utils::VARIABLE_TYPE_DVEC3, "" },
		{ TEST_CASE_TYPE_IMPLICIT, Utils::VARIABLE_TYPE_IVEC4, Utils::VARIABLE_TYPE_DVEC4, "" },
		{ TEST_CASE_TYPE_IMPLICIT, Utils::VARIABLE_TYPE_UINT, Utils::VARIABLE_TYPE_DOUBLE, "" },
		{ TEST_CASE_TYPE_IMPLICIT, Utils::VARIABLE_TYPE_UVEC2, Utils::VARIABLE_TYPE_DVEC2, "" },
		{ TEST_CASE_TYPE_IMPLICIT, Utils::VARIABLE_TYPE_UVEC3, Utils::VARIABLE_TYPE_DVEC3, "" },
		{ TEST_CASE_TYPE_IMPLICIT, Utils::VARIABLE_TYPE_UVEC4, Utils::VARIABLE_TYPE_DVEC4, "" },
		{ TEST_CASE_TYPE_IMPLICIT, Utils::VARIABLE_TYPE_FLOAT, Utils::VARIABLE_TYPE_DOUBLE, "" },
		{ TEST_CASE_TYPE_IMPLICIT, Utils::VARIABLE_TYPE_VEC2, Utils::VARIABLE_TYPE_DVEC2, "" },
		{ TEST_CASE_TYPE_IMPLICIT, Utils::VARIABLE_TYPE_VEC3, Utils::VARIABLE_TYPE_DVEC3, "" },
		{ TEST_CASE_TYPE_IMPLICIT, Utils::VARIABLE_TYPE_VEC4, Utils::VARIABLE_TYPE_DVEC4, "" },
		{ TEST_CASE_TYPE_IMPLICIT, Utils::VARIABLE_TYPE_MAT2, Utils::VARIABLE_TYPE_DMAT2, "" },
		{ TEST_CASE_TYPE_IMPLICIT, Utils::VARIABLE_TYPE_MAT3, Utils::VARIABLE_TYPE_DMAT3, "" },
		{ TEST_CASE_TYPE_IMPLICIT, Utils::VARIABLE_TYPE_MAT4, Utils::VARIABLE_TYPE_DMAT4, "" },
		{ TEST_CASE_TYPE_IMPLICIT, Utils::VARIABLE_TYPE_MAT2X3, Utils::VARIABLE_TYPE_DMAT2X3, "" },
		{ TEST_CASE_TYPE_IMPLICIT, Utils::VARIABLE_TYPE_MAT2X4, Utils::VARIABLE_TYPE_DMAT2X4, "" },
		{ TEST_CASE_TYPE_IMPLICIT, Utils::VARIABLE_TYPE_MAT3X2, Utils::VARIABLE_TYPE_DMAT3X2, "" },
		{ TEST_CASE_TYPE_IMPLICIT, Utils::VARIABLE_TYPE_MAT3X4, Utils::VARIABLE_TYPE_DMAT3X4, "" },
		{ TEST_CASE_TYPE_IMPLICIT, Utils::VARIABLE_TYPE_MAT4X2, Utils::VARIABLE_TYPE_DMAT4X2, "" },
		{ TEST_CASE_TYPE_IMPLICIT, Utils::VARIABLE_TYPE_MAT4X3, Utils::VARIABLE_TYPE_DMAT4X3, "" },

		{ TEST_CASE_TYPE_EXPLICIT, Utils::VARIABLE_TYPE_INT, Utils::VARIABLE_TYPE_DOUBLE, "" },
		{ TEST_CASE_TYPE_EXPLICIT, Utils::VARIABLE_TYPE_UINT, Utils::VARIABLE_TYPE_DOUBLE, "" },
		{ TEST_CASE_TYPE_EXPLICIT, Utils::VARIABLE_TYPE_FLOAT, Utils::VARIABLE_TYPE_DOUBLE, "" },
		{ TEST_CASE_TYPE_EXPLICIT, Utils::VARIABLE_TYPE_DOUBLE, Utils::VARIABLE_TYPE_INT, "" },
		{ TEST_CASE_TYPE_EXPLICIT, Utils::VARIABLE_TYPE_DOUBLE, Utils::VARIABLE_TYPE_UINT, "" },
		{ TEST_CASE_TYPE_EXPLICIT, Utils::VARIABLE_TYPE_DOUBLE, Utils::VARIABLE_TYPE_FLOAT, "" },
		{ TEST_CASE_TYPE_EXPLICIT, Utils::VARIABLE_TYPE_DOUBLE, Utils::VARIABLE_TYPE_BOOL, "" },
		{ TEST_CASE_TYPE_EXPLICIT, Utils::VARIABLE_TYPE_BOOL, Utils::VARIABLE_TYPE_DOUBLE, "" }
	};
	const unsigned int n_test_cases = sizeof(test_cases) / sizeof(test_cases[0]);

	/* Execute all iterations */
	for (unsigned int n_test_case = 0; n_test_case < n_test_cases; ++n_test_case)
	{
		_test_case& test_case = test_cases[n_test_case];

		/* Initialize a program object we will use to perform the casting */
		initIteration(test_case);

		/* Use the program object to XFB the results */
		m_has_test_passed &= executeIteration(test_case);

		/* Release the GL Resource for this sub test */
		deinitInteration();

	} /* for (all test cases) */
	/* We're done */
	if (m_has_test_passed)
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	}
	else
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
	}

	return STOP;
}